

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bellman_ford_test.cpp
# Opt level: O1

void benchmark(Graph *g,int times)

{
  pointer psVar1;
  void *pvVar2;
  int iVar3;
  ostream *poVar4;
  clock_t cVar5;
  clock_t cVar6;
  long lVar7;
  byte unaff_BPL;
  int iVar8;
  double __n;
  int s;
  WeightMap weight_pmap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> pred;
  vector<unsigned_long,_std::allocator<unsigned_long>_> b_pred;
  vector<long,_std::allocator<long>_> dist;
  vector<int,_std::allocator<int>_> b_dist;
  allocator_type local_b9;
  pointer local_b8;
  clock_t local_b0;
  Graph *local_a8;
  value_type_conflict2 local_a0;
  WeightMap local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<long,_std::allocator<long>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[i] ",4);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,times);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," time(s)",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  local_b8 = (g->super_type).m_vertices.
             super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (g->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __n = (double)((long)psVar1 - (long)local_b8 >> 5);
  local_98.tag = 0;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x7fff;
  local_a8 = g;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_48,(size_type)__n,(value_type_conflict3 *)&local_78,(allocator_type *)&local_90)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_78,(size_type)__n,(allocator_type *)&local_90);
  cVar5 = clock();
  if (times < 1) {
    local_b8 = (pointer)0x3ff0000000000000;
  }
  else {
    iVar8 = 0;
    local_b0 = cVar5;
    do {
      if (psVar1 != local_b8) {
        lVar7 = 0;
        do {
          *(long *)(CONCAT44(local_78.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,
                             local_78.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start._0_4_) + lVar7 * 8) = lVar7;
          lVar7 = lVar7 + 1;
        } while ((long)__n + (ulong)(__n == 0.0) != lVar7);
      }
      iVar3 = 0;
      if (times != 1) {
        iVar3 = randomRange(0,SUB84(__n,0));
      }
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar3] = 0;
      unaff_BPL = boost::
                  bellman_ford_shortest_paths<boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>,int,boost::adj_list_edge_property_map<boost::directed_tag,int,int&,unsigned_long,EdgeProperties,int_EdgeProperties::*>,unsigned_long*,int*,boost::closed_plus<int>,std::less<int>,boost::bellman_visitor<boost::null_visitor>>
                            (local_a8,(ulong)__n & 0xffffffff,local_98.tag,
                             CONCAT44(local_78.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                      local_78.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start._0_4_),
                             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start,0x7fffffff);
      iVar3 = iVar8;
    } while (((bool)unaff_BPL) && (iVar8 = iVar8 + 1, iVar3 = times, iVar8 != times));
    local_b8 = (pointer)(double)(iVar3 + 1);
    cVar5 = local_b0;
  }
  cVar6 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"      Average time boost: ",0x1a);
  poVar4 = std::ostream::_M_insert<double>(((double)(cVar6 - cVar5) / 1000000.0) / (double)local_b8)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds",8);
  if ((unaff_BPL & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," (negative cycle)",0x11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_90,(size_type)__n,(allocator_type *)&local_60);
  local_a0 = 0x7fff;
  std::vector<long,_std::allocator<long>_>::vector(&local_60,(size_type)__n,&local_a0,&local_b9);
  cVar5 = clock();
  if (0 < times) {
    local_b8 = (pointer)__n;
    local_b0 = cVar5;
    iVar8 = times;
    do {
      iVar3 = 0;
      if (times != 1) {
        iVar3 = randomRange(0,(int)local_b8);
      }
      local_a0 = CONCAT44(local_a0._4_4_,iVar3);
      unaff_BPL = bellmanFord(local_a8,(int *)&local_a0,&local_98,&local_90,&local_60);
      iVar8 = iVar8 + -1;
      cVar5 = local_b0;
    } while (iVar8 != 0);
  }
  cVar6 = clock();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"      Average time rafa: ",0x19);
  poVar4 = std::ostream::_M_insert<double>(((double)(cVar6 - cVar5) / 1000000.0) / (double)times);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," seconds",8);
  if ((unaff_BPL & 1) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," (negative cycle)",0x11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pvVar2 = (void *)CONCAT44(local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_78.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_78.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void benchmark(Graph g, int times)
{
    std::cout << "[i] " << times << " time(s)" << std::endl;
    int i;
    // setup
    unsigned long  N = num_vertices(g);

    // **************************************************** BOOST
    // init
    WeightMap weight_pmap = get(&EdgeProperties::weight, g);
    std::vector<int> b_dist(N, (std::numeric_limits < short >::max)());
    std::vector<std::size_t> b_pred(N);
    // run
    bool r_boost;
    clock_t begin = clock();
    for(i = 0; i<times ; ++i){
        for (unsigned long i = 0; i < N; ++i) b_pred[i] = i;
        int s = (times == 1) ? 0 : randomRange(0, (int)N);
        b_dist[s] = 0;
        r_boost = boost::bellman_ford_shortest_paths(
            g, int(N), weight_pmap, 
            &b_pred[0], &b_dist[0], 
            boost::closed_plus<int>(),
            std::less<int>(), 
            boost::default_bellman_visitor());
        if(!r_boost) break;
    }    
    clock_t end = clock();
    double elapsed_secs_boost = double(end-begin) / CLOCKS_PER_SEC / (i+1);
    // Info
    std::cout << "      Average time boost: " << elapsed_secs_boost << " seconds";
    if(!r_boost) std::cout << " (negative cycle)" << std::endl;
    else std::cout << std::endl;


    // **************************************************** RAFA
    // init
    std::vector<unsigned long> pred(N);
    std::vector<long> dist(N, (std::numeric_limits < short >::max)());
    // run
    begin = clock();
    bool r_rafa;
    for(i = 0; i<times ; ++i) {
        int s = (times == 1) ? 0 : randomRange(0, (int)N);
        r_rafa = bellmanFord(g, s, weight_pmap, pred, dist);
    }
    end = clock();
    double elapsed_secs_rafa = double(end - begin) / CLOCKS_PER_SEC / times;
    // Info
    std::cout << "      Average time rafa: " << elapsed_secs_rafa << " seconds";
    if(!r_rafa) std::cout << " (negative cycle)" << std::endl;
    else std::cout << std::endl;
}